

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O2

void ImGui::ShowStackToolWindow(bool *p_open)

{
  bool *v;
  uint uVar1;
  ImVec2 IVar2;
  ImGuiContext *pIVar3;
  ImGuiContext *pIVar4;
  bool bVar5;
  ImU32 color;
  ImVec4 *pIVar6;
  char cVar7;
  int stack_n;
  int n_00;
  ulong uVar8;
  char *pcVar9;
  char *pcVar10;
  long lVar11;
  int n;
  char *pcVar12;
  ulong uVar13;
  float fVar14;
  undefined4 uVar15;
  undefined4 uVar16;
  char level_desc [256];
  
  pIVar3 = GImGui;
  uVar1 = (GImGui->NextWindowData).Flags;
  if ((uVar1 & 2) == 0) {
    fVar14 = GImGui->FontSize;
    (GImGui->NextWindowData).Flags = uVar1 | 2;
    (pIVar3->NextWindowData).SizeVal.x = 0.0;
    (pIVar3->NextWindowData).SizeVal.y = fVar14 * 8.0;
    (pIVar3->NextWindowData).SizeCond = 4;
  }
  bVar5 = Begin("Dear ImGui Stack Tool",p_open,0);
  pIVar4 = GImGui;
  if (!bVar5) {
LAB_001d6c6f:
    End();
    return;
  }
  GImGui->CurrentWindow->WriteAccessed = true;
  if (1 < pIVar4->CurrentWindow->BeginCount) goto LAB_001d6c6f;
  Text("HoveredId: 0x%08X, ActiveId:  0x%08X",(ulong)pIVar3->HoveredIdPreviousFrame,
       (ulong)pIVar3->ActiveId);
  SameLine(0.0,-1.0);
  MetricsHelpMarker(
                   "Hover an item with the mouse to display elements of the ID Stack leading to the item\'s final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details."
                   );
  fVar14 = (float)pIVar3->Time - (pIVar3->DebugStackTool).CopyToClipboardLastTime;
  v = &(pIVar3->DebugStackTool).CopyToClipboardOnCtrlC;
  Checkbox("Ctrl+C: copy path to clipboard",v);
  SameLine(0.0,-1.0);
  if ((0.0 <= fVar14) && (fVar14 < 0.75)) {
    fVar14 = fmodf(fVar14,0.25);
    if (fVar14 < 0.125) {
      uVar15 = 0x3f800000;
      uVar16 = 0x3f800000;
      level_desc[8] = -0x66;
      level_desc[9] = -0x67;
      level_desc[10] = -0x67;
      level_desc[0xb] = '>';
      level_desc[0xc] = '\0';
      level_desc[0xd] = '\0';
      level_desc[0xe] = -0x80;
      level_desc[0xf] = '?';
      goto LAB_001d6d40;
    }
  }
  uVar15 = 0;
  uVar16 = 0;
  level_desc[8] = '\0';
  level_desc[9] = '\0';
  level_desc[10] = '\0';
  level_desc[0xb] = '\0';
  level_desc[0xc] = '\0';
  level_desc[0xd] = '\0';
  level_desc[0xe] = '\0';
  level_desc[0xf] = '\0';
LAB_001d6d40:
  level_desc[4] = (char)uVar16;
  level_desc[5] = (char)((uint)uVar16 >> 8);
  level_desc[6] = (char)((uint)uVar16 >> 0x10);
  level_desc[7] = (char)((uint)uVar16 >> 0x18);
  level_desc[0] = (char)uVar15;
  level_desc[1] = (char)((uint)uVar15 >> 8);
  level_desc[2] = (char)((uint)uVar15 >> 0x10);
  level_desc[3] = (char)((uint)uVar15 >> 0x18);
  TextColored((ImVec4 *)level_desc,"*COPIED*");
  if (*v == true) {
    bVar5 = IsKeyDown(ImGuiKey_ModCtrl);
    if (bVar5) {
      bVar5 = IsKeyPressed(ImGuiKey_C,true);
      if (bVar5) {
        (pIVar3->DebugStackTool).CopyToClipboardLastTime = (float)pIVar3->Time;
        pcVar10 = (pIVar3->TempBuffer).Data;
        pcVar12 = pcVar10 + (pIVar3->TempBuffer).Size;
        n_00 = 0;
        while ((n_00 < (pIVar3->DebugStackTool).Results.Size && (pcVar10 + 3 < pcVar12))) {
          *pcVar10 = '/';
          StackToolFormatLevelInfo(&pIVar3->DebugStackTool,n_00,false,level_desc,0x100);
          pIVar6 = (ImVec4 *)level_desc;
          pcVar9 = pcVar10;
          while( true ) {
            pcVar10 = pcVar9 + 1;
            cVar7 = *(char *)&pIVar6->x;
            if ((cVar7 == '\0') || (pcVar12 <= pcVar9 + 3)) break;
            if (cVar7 == '/') {
              pcVar9[1] = '\\';
              pcVar10 = pcVar9 + 2;
              cVar7 = *(char *)&pIVar6->x;
            }
            *pcVar10 = cVar7;
            pIVar6 = (ImVec4 *)((long)&pIVar6->x + 1);
            pcVar9 = pcVar10;
          }
          n_00 = n_00 + 1;
        }
        *pcVar10 = '\0';
        SetClipboardText((pIVar3->TempBuffer).Data);
      }
    }
  }
  (pIVar3->DebugStackTool).LastActiveFrame = pIVar3->FrameCount;
  if (0 < (pIVar3->DebugStackTool).Results.Size) {
    level_desc[0] = '\0';
    level_desc[1] = '\0';
    level_desc[2] = '\0';
    level_desc[3] = '\0';
    level_desc[4] = '\0';
    level_desc[5] = '\0';
    level_desc[6] = '\0';
    level_desc[7] = '\0';
    bVar5 = BeginTable("##table",3,0x780,(ImVec2 *)level_desc,0.0);
    if (bVar5) {
      IVar2 = CalcTextSize("0xDDDDDDDD",(char *)0x0,false,-1.0);
      TableSetupColumn("Seed",0x10,IVar2.x,0);
      TableSetupColumn("PushID",8,0.0,0);
      TableSetupColumn("Result",0x10,IVar2.x,0);
      TableHeadersRow();
      lVar11 = 0;
      for (uVar13 = 0; (long)uVar13 < (long)(pIVar3->DebugStackTool).Results.Size;
          uVar13 = uVar13 + 1) {
        TableNextColumn();
        if (lVar11 == 0) {
          uVar8 = 0;
        }
        else {
          uVar8 = (ulong)*(uint *)((pIVar3->DebugStackTool).Results.Data[-1].Desc + lVar11 + -7);
        }
        Text("0x%08X",uVar8);
        TableNextColumn();
        StackToolFormatLevelInfo
                  (&pIVar3->DebugStackTool,(int)uVar13,true,(pIVar3->TempBuffer).Data,
                   (long)(pIVar3->TempBuffer).Size);
        TextUnformatted((pIVar3->TempBuffer).Data,(char *)0x0);
        TableNextColumn();
        Text("0x%08X");
        if (uVar13 == (pIVar3->DebugStackTool).Results.Size - 1) {
          color = GetColorU32(0x18,1.0);
          TableSetBgColor(3,color,-1);
        }
        lVar11 = lVar11 + 0x40;
      }
      EndTable();
    }
  }
  End();
  return;
}

Assistant:

void ImGui::ShowStackToolWindow(bool* p_open)
{
    ImGuiContext& g = *GImGui;
    if (!(g.NextWindowData.Flags & ImGuiNextWindowDataFlags_HasSize))
        SetNextWindowSize(ImVec2(0.0f, GetFontSize() * 8.0f), ImGuiCond_FirstUseEver);
    if (!Begin("Dear ImGui Stack Tool", p_open) || GetCurrentWindow()->BeginCount > 1)
    {
        End();
        return;
    }

    // Display hovered/active status
    ImGuiStackTool* tool = &g.DebugStackTool;
    const ImGuiID hovered_id = g.HoveredIdPreviousFrame;
    const ImGuiID active_id = g.ActiveId;
#ifdef IMGUI_ENABLE_TEST_ENGINE
    Text("HoveredId: 0x%08X (\"%s\"), ActiveId:  0x%08X (\"%s\")", hovered_id, hovered_id ? ImGuiTestEngine_FindItemDebugLabel(&g, hovered_id) : "", active_id, active_id ? ImGuiTestEngine_FindItemDebugLabel(&g, active_id) : "");
#else
    Text("HoveredId: 0x%08X, ActiveId:  0x%08X", hovered_id, active_id);
#endif
    SameLine();
    MetricsHelpMarker("Hover an item with the mouse to display elements of the ID Stack leading to the item's final ID.\nEach level of the stack correspond to a PushID() call.\nAll levels of the stack are hashed together to make the final ID of a widget (ID displayed at the bottom level of the stack).\nRead FAQ entry about the ID stack for details.");

    // CTRL+C to copy path
    const float time_since_copy = (float)g.Time - tool->CopyToClipboardLastTime;
    Checkbox("Ctrl+C: copy path to clipboard", &tool->CopyToClipboardOnCtrlC);
    SameLine();
    TextColored((time_since_copy >= 0.0f && time_since_copy < 0.75f && ImFmod(time_since_copy, 0.25f) < 0.25f * 0.5f) ? ImVec4(1.f, 1.f, 0.3f, 1.f) : ImVec4(), "*COPIED*");
    if (tool->CopyToClipboardOnCtrlC && IsKeyDown(ImGuiMod_Ctrl) && IsKeyPressed(ImGuiKey_C))
    {
        tool->CopyToClipboardLastTime = (float)g.Time;
        char* p = g.TempBuffer.Data;
        char* p_end = p + g.TempBuffer.Size;
        for (int stack_n = 0; stack_n < tool->Results.Size && p + 3 < p_end; stack_n++)
        {
            *p++ = '/';
            char level_desc[256];
            StackToolFormatLevelInfo(tool, stack_n, false, level_desc, IM_ARRAYSIZE(level_desc));
            for (int n = 0; level_desc[n] && p + 2 < p_end; n++)
            {
                if (level_desc[n] == '/')
                    *p++ = '\\';
                *p++ = level_desc[n];
            }
        }
        *p = '\0';
        SetClipboardText(g.TempBuffer.Data);
    }

    // Display decorated stack
    tool->LastActiveFrame = g.FrameCount;
    if (tool->Results.Size > 0 && BeginTable("##table", 3, ImGuiTableFlags_Borders))
    {
        const float id_width = CalcTextSize("0xDDDDDDDD").x;
        TableSetupColumn("Seed", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableSetupColumn("PushID", ImGuiTableColumnFlags_WidthStretch);
        TableSetupColumn("Result", ImGuiTableColumnFlags_WidthFixed, id_width);
        TableHeadersRow();
        for (int n = 0; n < tool->Results.Size; n++)
        {
            ImGuiStackLevelInfo* info = &tool->Results[n];
            TableNextColumn();
            Text("0x%08X", (n > 0) ? tool->Results[n - 1].ID : 0);
            TableNextColumn();
            StackToolFormatLevelInfo(tool, n, true, g.TempBuffer.Data, g.TempBuffer.Size);
            TextUnformatted(g.TempBuffer.Data);
            TableNextColumn();
            Text("0x%08X", info->ID);
            if (n == tool->Results.Size - 1)
                TableSetBgColor(ImGuiTableBgTarget_CellBg, GetColorU32(ImGuiCol_Header));
        }
        EndTable();
    }
    End();
}